

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::operator==(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *this,GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *rhs)

{
  uint uVar1;
  Token *pTVar2;
  Token *pTVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  
  if ((rhs->parseErrorCode_ == kPointerParseErrorNone &&
       this->parseErrorCode_ == kPointerParseErrorNone) &&
     (sVar6 = this->tokenCount_, sVar6 == rhs->tokenCount_)) {
    pTVar2 = this->tokens_;
    pTVar3 = rhs->tokens_;
    lVar5 = 0xc;
    while( true ) {
      bVar7 = sVar6 == 0;
      sVar6 = sVar6 - 1;
      if (((bVar7) ||
          (*(int *)((long)&pTVar2->name + lVar5) != *(int *)((long)&pTVar3->name + lVar5))) ||
         (uVar1 = *(uint *)((long)pTVar2 + lVar5 + -4),
         uVar1 != *(uint *)((long)pTVar3 + lVar5 + -4))) break;
      if (((ulong)uVar1 != 0) &&
         (iVar4 = bcmp(*(void **)((long)pTVar2 + lVar5 + -0xc),
                       *(void **)((long)pTVar3 + lVar5 + -0xc),(ulong)uVar1), iVar4 != 0)) {
        return bVar7;
      }
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool operator==(const GenericPointer& rhs) const {
        if (!IsValid() || !rhs.IsValid() || tokenCount_ != rhs.tokenCount_)
            return false;

        for (size_t i = 0; i < tokenCount_; i++) {
            if (tokens_[i].index != rhs.tokens_[i].index ||
                tokens_[i].length != rhs.tokens_[i].length || 
                (tokens_[i].length != 0 && std::memcmp(tokens_[i].name, rhs.tokens_[i].name, sizeof(Ch)* tokens_[i].length) != 0))
            {
                return false;
            }
        }

        return true;
    }